

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

bool EqualNode::ParameterToLong(char *param,long *outResult)

{
  bool bVar1;
  int *piVar2;
  long local_98;
  long result;
  char *pEnd;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  int local_28;
  char local_21;
  int base;
  char isNegative;
  long *outResult_local;
  char *param_local;
  
  local_21 = *param == '-';
  local_28 = 0;
  _base = outResult;
  outResult_local = (long *)param;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,param);
  bVar1 = cmHasLiteralPrefix<3ul>(local_38,(char (*) [3])0xdfbe38);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,(char *)outResult_local);
    bVar1 = cmHasLiteralPrefix<3ul>(local_48,(char (*) [3])0xdfbe3c);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_58,(char *)outResult_local);
      bVar1 = cmHasLiteralPrefix<4ul>(local_58,(char (*) [4])"-0b");
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_68,(char *)outResult_local);
        bVar1 = cmHasLiteralPrefix<4ul>(local_68,(char (*) [4])"-0B");
        if (!bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_78,(char *)outResult_local);
          bVar1 = cmHasLiteralPrefix<4ul>(local_78,(char (*) [4])"+0b");
          if (!bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&pEnd,
                       (char *)outResult_local);
            bVar1 = cmHasLiteralPrefix<4ul>(_pEnd,(char (*) [4])"+0B");
            if (!bVar1) goto LAB_008e580b;
          }
        }
      }
      local_28 = 2;
      outResult_local = (long *)((long)outResult_local + 3);
      goto LAB_008e580b;
    }
  }
  local_28 = 2;
  outResult_local = (long *)((long)outResult_local + 2);
LAB_008e580b:
  local_98 = strtol((char *)outResult_local,(char **)&result,local_28);
  if ((((long *)result == outResult_local) || (*(char *)result != '\0')) ||
     (piVar2 = __errno_location(), *piVar2 == 0x22)) {
    param_local._7_1_ = false;
  }
  else {
    if ((local_21 != '\0') && (0 < local_98)) {
      local_98 = -local_98;
    }
    *_base = local_98;
    param_local._7_1_ = true;
  }
  return param_local._7_1_;
}

Assistant:

static bool ParameterToLong(const char* param, long* outResult)
  {
    const char isNegative = param[0] == '-';

    int base = 0;
    if (cmHasLiteralPrefix(param, "0b") || cmHasLiteralPrefix(param, "0B")) {
      base = 2;
      param += 2;
    } else if (cmHasLiteralPrefix(param, "-0b") ||
               cmHasLiteralPrefix(param, "-0B") ||
               cmHasLiteralPrefix(param, "+0b") ||
               cmHasLiteralPrefix(param, "+0B")) {
      base = 2;
      param += 3;
    }

    char* pEnd;
    long result = strtol(param, &pEnd, base);
    if (pEnd == param || *pEnd != '\0' || errno == ERANGE) {
      return false;
    }
    if (isNegative && result > 0) {
      result *= -1;
    }
    *outResult = result;
    return true;
  }